

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableIntTest_Constructors_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableIntTest_Constructors_Test
          (HashtableIntTest_Constructors_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  (this->
  super_HashtableIntTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__HashtableTest_00c22ec8;
  (this->
  super_HashtableIntTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c22f88;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&(this->
             super_HashtableIntTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.rep.table.groups);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, Constructors) {
  // The key/value types don't matter here, so I just test on one set
  // of tables, the ones with int keys, which can easily handle the
  // placement-news we have to do below.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  int alloc_count = 0;
  Alloc<typename TypeParam::key_type> alloc(2, &alloc_count);

  TypeParam ht_noarg;
  TypeParam ht_onearg(100);
  TypeParam ht_twoarg(100, hasher);
  TypeParam ht_threearg(100, hasher, hasher);  // hasher serves as key_equal too
  TypeParam ht_fourarg(100, hasher, hasher, alloc);

  // The allocator should have been called at most once, for the last ht.
  EXPECT_LE(1, alloc_count);
  int old_alloc_count = alloc_count;

  const typename TypeParam::value_type input[] = {
      this->UniqueObject(1), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};
  const int num_inputs = sizeof(input) / sizeof(input[0]);
  const typename TypeParam::value_type* begin = &input[0];
  const typename TypeParam::value_type* end = begin + num_inputs;
  TypeParam ht_iter_noarg(begin, end);
  TypeParam ht_iter_onearg(begin, end, 100);
  TypeParam ht_iter_twoarg(begin, end, 100, hasher);
  TypeParam ht_iter_threearg(begin, end, 100, hasher, hasher);
  TypeParam ht_iter_fourarg(begin, end, 100, hasher, hasher, alloc);
  // Now the allocator should have been called more.
  EXPECT_GT(alloc_count, old_alloc_count);
  old_alloc_count = alloc_count;

  // Let's do a lot more inserting and make sure the alloc-count goes up
  for (int i = 2; i < 2000; i++) ht_fourarg.insert(this->UniqueObject(i));
  EXPECT_GT(alloc_count, old_alloc_count);

  EXPECT_LT(ht_noarg.bucket_count(), 100u);
  EXPECT_GE(ht_onearg.bucket_count(), 100u);
  EXPECT_GE(ht_twoarg.bucket_count(), 100u);
  EXPECT_GE(ht_threearg.bucket_count(), 100u);
  EXPECT_GE(ht_fourarg.bucket_count(), 100u);
  EXPECT_GE(ht_iter_onearg.bucket_count(), 100u);

  // When we pass in a hasher -- it can serve both as the hash-function
  // and the key-equal function -- its id should be 1.  Where we don't
  // pass it in and use the default Hasher object, the id should be 0.
  EXPECT_EQ(0, ht_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_noarg.key_eq().id());
  EXPECT_EQ(0, ht_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_onearg.key_eq().id());
  EXPECT_EQ(1, ht_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_threearg.key_eq().id());

  EXPECT_EQ(0, ht_iter_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_noarg.key_eq().id());
  EXPECT_EQ(0, ht_iter_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_onearg.key_eq().id());
  EXPECT_EQ(1, ht_iter_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_iter_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_iter_threearg.key_eq().id());

  // Likewise for the allocator
  EXPECT_EQ(0, ht_threearg.get_allocator().id());
  EXPECT_EQ(0, ht_iter_threearg.get_allocator().id());
  EXPECT_EQ(2, ht_fourarg.get_allocator().id());
  EXPECT_EQ(2, ht_iter_fourarg.get_allocator().id());
}